

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

N_Vector SUNLinSolResid(SUNLinearSolver S)

{
  long in_RDI;
  N_Vector resid;
  undefined8 local_10;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x68) == 0) {
    local_10 = (N_Vector)0x0;
  }
  else {
    local_10 = (N_Vector)(**(code **)(*(long *)(in_RDI + 8) + 0x68))(in_RDI);
  }
  return local_10;
}

Assistant:

N_Vector SUNLinSolResid(SUNLinearSolver S)
{
  N_Vector resid;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->resid) { resid = S->ops->resid(S); }
  else { resid = NULL; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (resid);
}